

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O3

void __thiscall
crnlib::dxt1_endpoint_optimizer::compute_pca
          (dxt1_endpoint_optimizer *this,vec3F *axis,vec3F_array *norm_colors,vec3F *def)

{
  float fVar1;
  undefined1 auVar2 [16];
  double dVar3;
  uint i;
  uint uVar4;
  long lVar5;
  uint uVar6;
  float *pfVar7;
  ulong uVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  float fVar20;
  float fVar22;
  double dVar21;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  
  if ((ulong)norm_colors->m_size == 0) {
    dVar10 = 0.0;
    dVar11 = 0.0;
    dVar12 = 0.0;
    dVar13 = 0.0;
    dVar14 = 0.0;
    dVar15 = 0.0;
  }
  else {
    pfVar7 = norm_colors->m_p->m_s + 1;
    dVar10 = 0.0;
    dVar11 = 0.0;
    uVar8 = 0;
    dVar12 = 0.0;
    dVar13 = 0.0;
    dVar14 = 0.0;
    dVar15 = 0.0;
    do {
      fVar1 = ((vec<3U,_float> *)(pfVar7 + -1))->m_s[0];
      uVar4 = (this->m_unique_colors).m_p[uVar8].m_weight;
      fVar20 = (float)*(undefined8 *)pfVar7;
      fVar22 = (float)((ulong)*(undefined8 *)pfVar7 >> 0x20);
      if (uVar4 < 2) {
        dVar16 = (double)(fVar1 * fVar1);
        dVar17 = (double)(fVar1 * fVar20);
        dVar18 = (double)(fVar1 * fVar22);
        dVar19 = (double)(fVar20 * fVar22);
        dVar21 = (double)(fVar20 * fVar20);
        dVar23 = (double)(fVar22 * fVar22);
      }
      else {
        dVar23 = (double)uVar4;
        dVar16 = (double)(fVar1 * fVar1) * dVar23;
        dVar17 = (double)(fVar1 * fVar20) * dVar23;
        dVar18 = (double)(fVar1 * fVar22) * dVar23;
        dVar19 = (double)(fVar20 * fVar22) * dVar23;
        dVar21 = (double)(fVar20 * fVar20) * dVar23;
        dVar23 = (double)(fVar22 * fVar22) * dVar23;
      }
      dVar14 = dVar14 + dVar21;
      dVar15 = dVar15 + dVar23;
      dVar12 = dVar12 + dVar18;
      dVar13 = dVar13 + dVar19;
      dVar10 = dVar10 + dVar16;
      dVar11 = dVar11 + dVar17;
      uVar8 = uVar8 + 1;
      pfVar7 = pfVar7 + 3;
    } while (norm_colors->m_size != uVar8);
  }
  dVar16 = 0.699999988079071;
  dVar17 = 0.8999999761581421;
  dVar18 = 1.0;
  uVar4 = 0;
  do {
    dVar23 = dVar16 * dVar12 + dVar18 * dVar11 + dVar17 * dVar10;
    dVar26 = dVar16 * dVar13 + dVar18 * dVar14 + dVar17 * dVar11;
    dVar21 = dVar15 * dVar16 + dVar13 * dVar18 + dVar12 * dVar17;
    dVar19 = ABS(dVar23);
    if (ABS(dVar23) <= ABS(dVar26)) {
      dVar19 = ABS(dVar26);
    }
    if (dVar19 <= ABS(dVar21)) {
      dVar19 = ABS(dVar21);
    }
    dVar3 = 1.0 / dVar19;
    if (1e-10 < dVar19) {
      dVar21 = dVar21 * dVar3;
    }
    uVar6 = (uint)(1e-10 < dVar19);
    auVar24._0_8_ = CONCAT44((int)(uVar6 << 0x1f) >> 0x1f,(int)(uVar6 << 0x1f) >> 0x1f);
    auVar24._8_4_ = (int)(uVar6 << 0x1f) >> 0x1f;
    auVar24._12_4_ = (int)(uVar6 << 0x1f) >> 0x1f;
    uVar8 = (ulong)(dVar3 * dVar26) & auVar24._8_8_;
    auVar25._0_8_ = ~auVar24._0_8_ & (ulong)dVar23;
    auVar25._8_8_ = ~auVar24._8_8_ & (ulong)dVar26;
    auVar2._8_4_ = (int)uVar8;
    auVar2._0_8_ = (ulong)(dVar3 * dVar23) & auVar24._0_8_;
    auVar2._12_4_ = (int)(uVar8 >> 0x20);
    dVar19 = SUB168(auVar25 | auVar2,0);
    dVar23 = SUB168(auVar25 | auVar2,8);
  } while ((uVar4 < 3 ||
            1e-08 <= (dVar16 - dVar21) * (dVar16 - dVar21) +
                     (dVar18 - dVar23) * (dVar18 - dVar23) + (dVar17 - dVar19) * (dVar17 - dVar19))
          && (bVar9 = uVar4 != 7, dVar16 = dVar21, dVar17 = dVar19, dVar18 = dVar23,
             uVar4 = uVar4 + 1, bVar9));
  dVar10 = dVar21 * dVar21 + dVar23 * dVar23 + dVar19 * dVar19;
  if (1e-10 <= dVar10) {
    dVar10 = 1.0 / SQRT(dVar10);
    *(ulong *)axis->m_s = CONCAT44((float)(dVar23 * dVar10),(float)(dVar19 * dVar10));
    axis->m_s[2] = (float)(dVar21 * dVar10);
    return;
  }
  if (axis != def) {
    lVar5 = 0;
    do {
      axis->m_s[lVar5] = def->m_s[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
  }
  return;
}

Assistant:

void dxt1_endpoint_optimizer::compute_pca(vec3F& axis, const vec3F_array& norm_colors, const vec3F& def) {
  double cov[6] = {0, 0, 0, 0, 0, 0};
  for (uint i = 0; i < norm_colors.size(); i++) {
    const vec3F& v = norm_colors[i];
    float r = v[0];
    float g = v[1];
    float b = v[2];
    if (m_unique_colors[i].m_weight > 1) {
      const double weight = m_unique_colors[i].m_weight;
      cov[0] += r * r * weight;
      cov[1] += r * g * weight;
      cov[2] += r * b * weight;
      cov[3] += g * g * weight;
      cov[4] += g * b * weight;
      cov[5] += b * b * weight;
    } else {
      cov[0] += r * r;
      cov[1] += r * g;
      cov[2] += r * b;
      cov[3] += g * g;
      cov[4] += g * b;
      cov[5] += b * b;
    }
  }
  double vfr = .9f;
  double vfg = 1.0f;
  double vfb = .7f;
  for (uint iter = 0; iter < 8; iter++) {
    double r = vfr * cov[0] + vfg * cov[1] + vfb * cov[2];
    double g = vfr * cov[1] + vfg * cov[3] + vfb * cov[4];
    double b = vfr * cov[2] + vfg * cov[4] + vfb * cov[5];
    double m = math::maximum(fabs(r), fabs(g), fabs(b));
    if (m > 1e-10) {
      m = 1.0f / m;
      r *= m;
      g *= m;
      b *= m;
    }
    double delta = math::square(vfr - r) + math::square(vfg - g) + math::square(vfb - b);
    vfr = r;
    vfg = g;
    vfb = b;
    if ((iter > 2) && (delta < 1e-8))
      break;
  }
  double len = vfr * vfr + vfg * vfg + vfb * vfb;
  if (len < 1e-10) {
    axis = def;
  } else {
    len = 1.0f / sqrt(len);
    axis.set(static_cast<float>(vfr * len), static_cast<float>(vfg * len), static_cast<float>(vfb * len));
  }
}